

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

bool __thiscall QAbstractScrollArea::event(QAbstractScrollArea *this,QEvent *e)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ushort uVar3;
  QAbstractScrollAreaPrivate *this_00;
  QWidget *pQVar4;
  QScrollBar *this_01;
  long lVar5;
  QAbstractSlider *pQVar6;
  QAbstractSlider *pQVar7;
  Representation RVar8;
  bool bVar9;
  char cVar10;
  undefined4 extraout_EAX;
  int extraout_EAX_00;
  uint uVar11;
  int iVar12;
  QAbstractScrollAreaPrivate *d_3;
  QPanGesture *this_02;
  QStyle *pQVar13;
  QPoint QVar14;
  ulong uVar15;
  QAbstractScrollAreaPrivate *d;
  ulong uVar16;
  QScrollEvent *se;
  QAbstractScrollAreaPrivate *d_1;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Representation RVar23;
  int iVar25;
  undefined1 auVar24 [16];
  QPointF QVar26;
  QPainter p;
  QStyleOption option;
  double local_98;
  undefined1 *local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractScrollAreaPrivate **)(this + 8);
  uVar3 = *(ushort *)(e + 8);
  cVar10 = '\0';
  uVar11 = (uint)uVar3;
  if (99 < uVar3) {
    if (uVar3 < 0xc2) {
      if (uVar3 == 100) {
LAB_003933f4:
        QAbstractScrollAreaPrivate::layoutChildren(this_00);
      }
      else {
        if (uVar3 == 0x6d) {
          QWidget::setAttribute
                    (this_00->viewport,WA_MouseTracking,
                     SUB41((*(uint *)(*(long *)(this + 0x20) + 8) & 4) >> 2,0));
          goto LAB_00393745;
        }
        if (uVar3 == 0x98) {
          pQVar4 = this_00->viewport;
          cVar10 = '\x01';
          if (pQVar4 != (QWidget *)0x0) {
            bVar9 = QWidget::acceptDrops((QWidget *)this);
            QWidget::setAcceptDrops(pQVar4,bVar9);
          }
          goto switchD_003932d0_caseD_2;
        }
      }
    }
    else if (uVar11 - 0xc2 < 0xc) {
      switch(uVar11) {
      case 0xc2:
      case 0xc3:
      case 0xc4:
        break;
      default:
        goto switchD_003932d0_caseD_6;
      case 0xc6:
        this_02 = (QPanGesture *)QGestureEvent::gesture((QGestureEvent *)e,PanGesture);
        cVar10 = this_02 != (QPanGesture *)0x0;
        if ((bool)cVar10) {
          pQVar6 = *(QAbstractSlider **)(*(long *)(this + 8) + 0x288);
          pQVar7 = *(QAbstractSlider **)(*(long *)(this + 8) + 0x290);
          QVar26 = QPanGesture::delta(this_02);
          dVar19 = QVar26.yp;
          local_98 = QVar26.xp;
          cVar10 = '\x01';
          if ((((local_98 != 0.0) || (NAN(local_98))) || (dVar19 != 0.0)) || (NAN(dVar19))) {
            iVar25 = QGuiApplication::layoutDirection();
            if (iVar25 == 1) {
              local_98 = -local_98;
            }
            iVar25 = QAbstractSlider::value(pQVar6);
            iVar12 = QAbstractSlider::value(pQVar7);
            QAbstractSlider::setValue(pQVar6,(int)((double)iVar25 - local_98));
            QAbstractSlider::setValue(pQVar7,(int)((double)iVar12 - dVar19));
          }
        }
        break;
      case 0xcc:
        auVar21._0_8_ =
             (double)((ulong)*(double *)(e + 0x40) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x40);
        auVar21._8_8_ =
             (double)((ulong)*(double *)(e + 0x48) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x48);
        auVar17 = minpd(_DAT_0066f5d0,auVar21);
        auVar22._8_8_ = -(ulong)(-2147483648.0 < auVar17._8_8_);
        auVar22._0_8_ = -(ulong)(-2147483648.0 < auVar17._0_8_);
        uVar11 = movmskpd((&switchD_003931ef::switchdataD_00681358)[uVar11 - 0xc2] + 0x681358,
                          auVar22);
        uVar16 = 0x8000000000000000;
        if ((uVar11 & 2) != 0) {
          uVar16 = (ulong)(uint)(int)auVar17._8_8_ << 0x20;
        }
        uVar15 = 0x80000000;
        if ((uVar11 & 1) != 0) {
          uVar15 = (ulong)(uint)(int)auVar17._0_8_;
        }
        local_78._0_8_ = uVar15 | uVar16;
        cVar10 = (**(code **)(*(long *)&(this_00->super_QFramePrivate).super_QWidgetPrivate + 0xb0))
                           (this_00);
        if (cVar10 != '\0') {
          lVar5 = *(long *)(this + 8);
          pQVar6 = *(QAbstractSlider **)(lVar5 + 0x288);
          pQVar7 = *(QAbstractSlider **)(lVar5 + 0x290);
          lVar5 = *(long *)(*(long *)(lVar5 + 0x2b0) + 0x20);
          uVar1 = *(undefined8 *)(lVar5 + 0x1c);
          uVar2 = *(undefined8 *)(lVar5 + 0x14);
          local_78._8_8_ = (double)(((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1)
          ;
          local_78._0_8_ = (double)(((int)uVar1 - (int)uVar2) + 1);
          QScrollPrepareEvent::setViewportSize((QSizeF *)e);
          iVar25 = QAbstractSlider::maximum(pQVar6);
          iVar12 = QAbstractSlider::maximum(pQVar7);
          puStack_60 = (undefined1 *)(double)iVar12;
          local_78 = (undefined1  [16])0x0;
          local_68 = (undefined1 *)(double)iVar25;
          QScrollPrepareEvent::setContentPosRange((QRectF *)e);
          iVar25 = QAbstractSlider::value(pQVar6);
          iVar12 = QAbstractSlider::value(pQVar7);
          local_78._8_8_ = (double)iVar12;
          local_78._0_8_ = (double)iVar25;
          QScrollPrepareEvent::setContentPos((QPointF *)e);
          e[0xc] = (QEvent)0x1;
        }
        break;
      case 0xcd:
        this_01 = this_00->vbar;
        QAbstractSlider::setValue(&this_00->hbar->super_QAbstractSlider,(int)*(double *)(e + 0x10));
        QAbstractSlider::setValue(&this_01->super_QAbstractSlider,(int)*(double *)(e + 0x18));
        auVar17._0_8_ =
             (double)((ulong)*(double *)(e + 0x20) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x20);
        auVar17._8_8_ =
             (double)((ulong)*(double *)(e + 0x28) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x28);
        auVar17 = minpd(_DAT_0066f5d0,auVar17);
        auVar17 = maxpd(auVar17,_DAT_0066f5e0);
        RVar23 = (this_00->overshoot).xp;
        RVar8 = (this_00->overshoot).yp;
        auVar24._0_4_ = -(uint)(RVar23.m_i == (int)auVar17._0_8_);
        iVar25 = -(uint)(RVar8.m_i == (int)auVar17._8_8_);
        auVar24._4_4_ = auVar24._0_4_;
        auVar24._8_4_ = iVar25;
        auVar24._12_4_ = iVar25;
        iVar25 = movmskpd(extraout_EAX,auVar24);
        if (iVar25 != 3) {
          pQVar4 = *(QWidget **)(*(long *)(this + 8) + 0x2b0);
          QVar14 = QWidget::pos(pQVar4);
          local_78._4_4_ = QVar14.yp.m_i.m_i + (RVar8.m_i - (int)auVar17._8_8_);
          local_78._0_4_ = QVar14.xp.m_i.m_i + (RVar23.m_i - (int)auVar17._0_8_);
          QWidget::move(pQVar4,(QPoint *)local_78);
          iVar25 = extraout_EAX_00;
        }
        auVar20._0_8_ =
             (double)((ulong)*(double *)(e + 0x20) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x20);
        auVar20._8_8_ =
             (double)((ulong)*(double *)(e + 0x28) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x28);
        auVar17 = minpd(_DAT_0066f5d0,auVar20);
        auVar18._8_8_ = -(ulong)(-2147483648.0 < auVar17._8_8_);
        auVar18._0_8_ = -(ulong)(-2147483648.0 < auVar17._0_8_);
        uVar11 = movmskpd(iVar25,auVar18);
        uVar16 = 0x8000000000000000;
        if ((uVar11 & 2) != 0) {
          uVar16 = (ulong)(uint)(int)auVar17._8_8_ << 0x20;
        }
        uVar15 = 0x80000000;
        if ((uVar11 & 1) != 0) {
          uVar15 = (ulong)(uint)(int)auVar17._0_8_;
        }
        this_00->overshoot = (QPoint)(uVar15 | uVar16);
        goto LAB_00393745;
      }
      goto switchD_003932d0_caseD_2;
    }
    goto switchD_003932d0_caseD_6;
  }
  uVar16 = (ulong)(uVar3 - 0x1f);
  if (uVar3 - 0x1f < 0x3c) {
    if ((0x1e0000001U >> (uVar16 & 0x3f) & 1) != 0) goto switchD_003932d0_caseD_2;
    if ((0x800200000000040U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_003933f4;
    if (uVar16 == 0x33) {
      if (e[0x38] != (QEvent)0x1) {
        e[0xc] = (QEvent)0x0;
        goto LAB_00393745;
      }
      goto switchD_003932d0_caseD_6;
    }
  }
  switch(uVar11) {
  case 2:
  case 3:
  case 4:
  case 5:
    break;
  default:
    goto switchD_003932d0_caseD_6;
  case 0xc:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
    QStyleOption::initFrom((QStyleOption *)local_78,(QWidget *)this);
    if (((this_00->cornerPaintingRect).x1.m_i <= (this_00->cornerPaintingRect).x2.m_i) &&
       ((this_00->cornerPaintingRect).y1.m_i <= (this_00->cornerPaintingRect).y2.m_i)) {
      local_68 = *(undefined1 **)&this_00->cornerPaintingRect;
      puStack_60 = *(undefined1 **)&(this_00->cornerPaintingRect).x2;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter((QPainter *)&local_80,(QPaintDevice *)(this + 0x10));
      pQVar13 = QWidget::style((QWidget *)this);
      (**(code **)(*(long *)pQVar13 + 0xb0))(pQVar13,0x28,local_78,(QPainter *)&local_80,this);
      QPainter::~QPainter((QPainter *)&local_80);
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
    QFrame::paintEvent((QFrame *)this,(QPaintEvent *)e);
LAB_00393745:
    cVar10 = '\x01';
    break;
  case 0xe:
    cVar10 = '\x01';
    if (this_00->inResize == false) {
      this_00->inResize = true;
      QAbstractScrollAreaPrivate::layoutChildren(this_00);
      this_00->inResize = false;
    }
    break;
  case 0x11:
    if ((this_00->shownOnce == false) && (this_00->sizeAdjustPolicy == AdjustToContentsOnFirstShow))
    {
      (this_00->sizeHint).wd = -1;
      (this_00->sizeHint).ht = -1;
      QWidget::updateGeometry((QWidget *)this);
    }
    this_00->shownOnce = true;
    goto switchD_003932d0_caseD_6;
  }
switchD_003932d0_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)cVar10;
  }
LAB_00393767:
  __stack_chk_fail();
switchD_003932d0_caseD_6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    bVar9 = QFrame::event((QFrame *)this,e);
    return bVar9;
  }
  goto LAB_00393767;
}

Assistant:

bool QAbstractScrollArea::event(QEvent *e)
{
    Q_D(QAbstractScrollArea);
    switch (e->type()) {
    case QEvent::AcceptDropsChange:
        // There was a chance that with accessibility client we get an
        // event before the viewport was created.
        // Also, in some cases we might get here from QWidget::event() virtual function which is (indirectly) called
        // from the viewport constructor at the time when the d->viewport is not yet initialized even without any
        // accessibility client. See qabstractscrollarea autotest for a test case.
        if (d->viewport)
            d->viewport->setAcceptDrops(acceptDrops());
        break;
    case QEvent::MouseTrackingChange:
        d->viewport->setMouseTracking(hasMouseTracking());
        break;
    case QEvent::Resize:
        if (!d->inResize) {
            d->inResize = true;
            d->layoutChildren();
            d->inResize = false;
        }
        break;
    case QEvent::Show:
        if (!d->shownOnce && d->sizeAdjustPolicy == QAbstractScrollArea::AdjustToContentsOnFirstShow) {
            d->sizeHint = QSize();
            updateGeometry();
        }
        d->shownOnce = true;
        return QFrame::event(e);
    case QEvent::Paint: {
        QStyleOption option;
        option.initFrom(this);
        if (d->cornerPaintingRect.isValid()) {
            option.rect = d->cornerPaintingRect;
            QPainter p(this);
            style()->drawPrimitive(QStyle::PE_PanelScrollAreaCorner, &option, &p, this);
        }
        }
        QFrame::paintEvent((QPaintEvent*)e);
        break;
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard)
           return QFrame::event(e);
        e->ignore();
        break;
#endif // QT_NO_CONTEXTMENU
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
    case QEvent::MouseMove:
    case QEvent::Wheel:
#if QT_CONFIG(draganddrop)
    case QEvent::Drop:
    case QEvent::DragEnter:
    case QEvent::DragMove:
    case QEvent::DragLeave:
#endif
        // ignore touch events in case they have been propagated from the viewport
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        return false;
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
    {
        QGestureEvent *ge = static_cast<QGestureEvent *>(e);
        QPanGesture *g = static_cast<QPanGesture *>(ge->gesture(Qt::PanGesture));
        if (g) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            QPointF delta = g->delta();
            if (!delta.isNull()) {
                if (QGuiApplication::isRightToLeft())
                    delta.rx() *= -1;
                int newX = hBar->value() - delta.x();
                int newY = vBar->value() - delta.y();
                hBar->setValue(newX);
                vBar->setValue(newY);
            }
            return true;
        }
        return false;
    }
#endif // QT_NO_GESTURES
    case QEvent::ScrollPrepare:
    {
        QScrollPrepareEvent *se = static_cast<QScrollPrepareEvent *>(e);
        if (d->canStartScrollingAt(se->startPos().toPoint())) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();

            se->setViewportSize(QSizeF(viewport()->size()));
            se->setContentPosRange(QRectF(0, 0, hBar->maximum(), vBar->maximum()));
            se->setContentPos(QPointF(hBar->value(), vBar->value()));
            se->accept();
            return true;
        }
        return false;
    }
    case QEvent::Scroll:
    {
        QScrollEvent *se = static_cast<QScrollEvent *>(e);

        QScrollBar *hBar = horizontalScrollBar();
        QScrollBar *vBar = verticalScrollBar();
        hBar->setValue(se->contentPos().x());
        vBar->setValue(se->contentPos().y());

        QPoint delta = d->overshoot - se->overshootDistance().toPoint();
        if (!delta.isNull())
            viewport()->move(viewport()->pos() + delta);

        d->overshoot = se->overshootDistance().toPoint();

        return true;
    }
    case QEvent::StyleChange:
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
    case QEvent::LayoutRequest:
        d->layoutChildren();
        Q_FALLTHROUGH();
    default:
        return QFrame::event(e);
    }
    return true;
}